

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void slang::SVInt::buildDivideResult
               (SVInt *result,uint32_t *value,bitwidth_t bitWidth,bool signFlag,uint32_t numWords)

{
  ulong uVar1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint local_28;
  byte local_23;
  
  if (result != (SVInt *)0x0) {
    if (numWords == 1) {
      SVInt((SVInt *)&local_30,bitWidth,*(uint64_t *)value,signFlag);
      operator=(result,(SVInt *)&local_30);
      if (((0x40 < local_28) || ((local_23 & 1) != 0)) && ((void *)local_30.val != (void *)0x0)) {
        operator_delete__(local_30.pVal);
      }
    }
    else {
      SVInt((SVInt *)&local_30,bitWidth,0,signFlag);
      operator=(result,(SVInt *)&local_30);
      if (((0x40 < local_28) || ((local_23 & 1) != 0)) && ((void *)local_30.val != (void *)0x0)) {
        operator_delete__(local_30.pVal);
      }
      if (numWords != 0) {
        uVar1 = 0;
        do {
          *(ulong *)((long)(result->super_SVIntStorage).field_0.pVal + uVar1 * 4) =
               CONCAT44(value[(int)uVar1 + 1],value[uVar1 & 0xffffffff]);
          uVar1 = uVar1 + 2;
        } while ((ulong)numWords * 2 != uVar1);
      }
    }
  }
  return;
}

Assistant:

void SVInt::buildDivideResult(SVInt* result, uint32_t* value, bitwidth_t bitWidth, bool signFlag,
                              uint32_t numWords) {
    if (!result)
        return;

    if (numWords == 1) {
        uint64_t val = uint64_t(value[0]) | (uint64_t(value[1]) << (BITS_PER_WORD / 2));
        *result = SVInt(bitWidth, val, signFlag);
    }
    else {
        *result = SVInt(bitWidth, 0, signFlag);
        for (uint32_t i = 0; i < numWords; i++)
            result->pVal[i] = uint64_t(value[i * 2]) |
                              (uint64_t(value[i * 2 + 1]) << (BITS_PER_WORD / 2));
    }
}